

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void newBinGE(IntView<0> x,IntView<0> y,BoolView *r)

{
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  IntView<1> _y_03;
  IntView<1> _y_04;
  IntView<5> _y_05;
  IntView<5> _y_06;
  IntView<0> _y_07;
  IntView<0> _y_08;
  IntView<0> _y_09;
  IntView<0> _y_10;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  IntView<0> _x_03;
  IntView<0> _x_04;
  IntView<0> _x_05;
  IntView<0> _x_06;
  IntView<1> _x_07;
  IntView<1> _x_08;
  IntView<5> _x_09;
  IntView<5> _x_10;
  bool bVar1;
  int iVar2;
  int iVar3;
  BinGE<0,_0,_0> *this;
  BinGE<0,_4,_0> *this_00;
  BinGE<0,_1,_0> *this_01;
  BinGE<0,_5,_0> *this_02;
  BinGE<1,_0,_0> *this_03;
  BinGE<5,_0,_0> *this_04;
  IntView<0> y_local;
  IntView<0> x_local;
  BoolView local_e8;
  BoolView local_d8;
  BoolView local_c8;
  BoolView local_b8;
  BoolView local_a8;
  BoolView local_98;
  BoolView local_88;
  BoolView local_78;
  BoolView local_68;
  BoolView local_58;
  BoolView local_48;
  BoolView local_38;
  
  x_local._8_8_ = x._8_8_;
  x_local.var = x.var;
  y_local._8_8_ = y._8_8_;
  y_local.var = y.var;
  iVar2 = IntView<0>::getType(&x_local);
  iVar3 = IntView<0>::getType(&y_local);
  if (iVar3 == 0 && iVar2 == 0) {
    bVar1 = BoolView::isTrue(r);
    this = (BinGE<0,_0,_0> *)operator_new(0x48);
    _x_00.a = x_local.a;
    _x_00.b = x_local.b;
    _x_00.var = x_local.var;
    _x.a = x_local.a;
    _x.b = x_local.b;
    _x.var = x_local.var;
    _y_00.a = y_local.a;
    _y_00.b = y_local.b;
    _y_00.var = y_local.var;
    _y.a = y_local.a;
    _y.b = y_local.b;
    _y.var = y_local.var;
    if (bVar1) {
      local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_38.v = r->v;
      local_38.s = r->s;
      BinGE<0,_0,_0>::BinGE(this,_x,_y,&local_38);
    }
    else {
      local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_48.v = r->v;
      local_48.s = r->s;
      BinGE<0,_0,_1>::BinGE((BinGE<0,_0,_1> *)this,_x_00,_y_00,&local_48);
    }
  }
  if (iVar3 == 4 && iVar2 == 0) {
    bVar1 = BoolView::isTrue(r);
    this_00 = (BinGE<0,_4,_0> *)operator_new(0x48);
    _x_02.a = x_local.a;
    _x_02.b = x_local.b;
    _x_02.var = x_local.var;
    _x_01.a = x_local.a;
    _x_01.b = x_local.b;
    _x_01.var = x_local.var;
    _y_02.a = y_local.a;
    _y_02.b = y_local.b;
    _y_02.var = y_local.var;
    _y_01.a = y_local.a;
    _y_01.b = y_local.b;
    _y_01.var = y_local.var;
    if (bVar1) {
      local_58.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_58.v = r->v;
      local_58.s = r->s;
      BinGE<0,_4,_0>::BinGE(this_00,_x_01,_y_01,&local_58);
    }
    else {
      local_68.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_68.v = r->v;
      local_68.s = r->s;
      BinGE<0,_4,_1>::BinGE((BinGE<0,_4,_1> *)this_00,_x_02,_y_02,&local_68);
    }
  }
  else if (iVar3 == 1 && iVar2 == 0) {
    bVar1 = BoolView::isTrue(r);
    this_01 = (BinGE<0,_1,_0> *)operator_new(0x48);
    _x_04.a = x_local.a;
    _x_04.b = x_local.b;
    _x_04.var = x_local.var;
    _x_03.a = x_local.a;
    _x_03.b = x_local.b;
    _x_03.var = x_local.var;
    _y_04.a = y_local.a;
    _y_04.b = y_local.b;
    _y_04.var = y_local.var;
    _y_03.a = y_local.a;
    _y_03.b = y_local.b;
    _y_03.var = y_local.var;
    if (bVar1) {
      local_78.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_78.v = r->v;
      local_78.s = r->s;
      BinGE<0,_1,_0>::BinGE(this_01,_x_03,_y_03,&local_78);
    }
    else {
      local_88.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_88.v = r->v;
      local_88.s = r->s;
      BinGE<0,_1,_1>::BinGE((BinGE<0,_1,_1> *)this_01,_x_04,_y_04,&local_88);
    }
  }
  else if (iVar3 == 5 && iVar2 == 0) {
    bVar1 = BoolView::isTrue(r);
    this_02 = (BinGE<0,_5,_0> *)operator_new(0x48);
    _x_06.a = x_local.a;
    _x_06.b = x_local.b;
    _x_06.var = x_local.var;
    _x_05.a = x_local.a;
    _x_05.b = x_local.b;
    _x_05.var = x_local.var;
    _y_06.a = y_local.a;
    _y_06.b = y_local.b;
    _y_06.var = y_local.var;
    _y_05.a = y_local.a;
    _y_05.b = y_local.b;
    _y_05.var = y_local.var;
    if (bVar1) {
      local_98.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_98.v = r->v;
      local_98.s = r->s;
      BinGE<0,_5,_0>::BinGE(this_02,_x_05,_y_05,&local_98);
    }
    else {
      local_a8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_a8.v = r->v;
      local_a8.s = r->s;
      BinGE<0,_5,_1>::BinGE((BinGE<0,_5,_1> *)this_02,_x_06,_y_06,&local_a8);
    }
  }
  else if (iVar2 == 1 && iVar3 == 0) {
    bVar1 = BoolView::isTrue(r);
    this_03 = (BinGE<1,_0,_0> *)operator_new(0x48);
    _x_08.a = x_local.a;
    _x_08.b = x_local.b;
    _x_08.var = x_local.var;
    _x_07.a = x_local.a;
    _x_07.b = x_local.b;
    _x_07.var = x_local.var;
    _y_08.a = y_local.a;
    _y_08.b = y_local.b;
    _y_08.var = y_local.var;
    _y_07.a = y_local.a;
    _y_07.b = y_local.b;
    _y_07.var = y_local.var;
    if (bVar1) {
      local_b8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_b8.v = r->v;
      local_b8.s = r->s;
      BinGE<1,_0,_0>::BinGE(this_03,_x_07,_y_07,&local_b8);
    }
    else {
      local_c8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_c8.v = r->v;
      local_c8.s = r->s;
      BinGE<1,_0,_1>::BinGE((BinGE<1,_0,_1> *)this_03,_x_08,_y_08,&local_c8);
    }
  }
  else if (iVar2 == 5 && iVar3 == 0) {
    bVar1 = BoolView::isTrue(r);
    this_04 = (BinGE<5,_0,_0> *)operator_new(0x48);
    _x_10.a = x_local.a;
    _x_10.b = x_local.b;
    _x_10.var = x_local.var;
    _x_09.a = x_local.a;
    _x_09.b = x_local.b;
    _x_09.var = x_local.var;
    _y_10.a = y_local.a;
    _y_10.b = y_local.b;
    _y_10.var = y_local.var;
    _y_09.a = y_local.a;
    _y_09.b = y_local.b;
    _y_09.var = y_local.var;
    if (bVar1) {
      local_d8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_d8.v = r->v;
      local_d8.s = r->s;
      BinGE<5,_0,_0>::BinGE(this_04,_x_09,_y_09,&local_d8);
    }
    else {
      local_e8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_e8.v = r->v;
      local_e8.s = r->s;
      BinGE<5,_0,_1>::BinGE((BinGE<5,_0,_1> *)this_04,_x_10,_y_10,&local_e8);
    }
  }
  return;
}

Assistant:

void newBinGE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinGE, 0, 0);
	BinProp(BinGE, 0, 4);
	BinProp(BinGE, 0, 1);
	BinProp(BinGE, 0, 5);
	BinProp(BinGE, 1, 0);
	BinProp(BinGE, 5, 0);

	assert(p);
}